

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O1

Object * __thiscall
flatbuffers::BaseBfbsGenerator::GetObject(BaseBfbsGenerator *this,Type *type,bool element_type)

{
  long lVar1;
  Object *pOVar2;
  unsigned_short vtsize;
  undefined7 in_register_00000011;
  ushort uVar3;
  bool bVar4;
  
  lVar1 = -(long)*(int *)type;
  if ((int)CONCAT71(in_register_00000011,element_type) == 0) {
    if (4 < *(ushort *)(type + -(long)*(int *)type)) {
      uVar3 = *(ushort *)(type + lVar1 + 4);
      goto LAB_0032f4cd;
    }
  }
  else if (6 < *(ushort *)(type + -(long)*(int *)type)) {
    uVar3 = *(ushort *)(type + lVar1 + 6);
    goto LAB_0032f4cd;
  }
  uVar3 = 0;
LAB_0032f4cd:
  if (uVar3 == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = type[uVar3].super_Table == (Table)0xf;
  }
  lVar1 = -(long)*(int *)type;
  if (*(ushort *)(type + -(long)*(int *)type) < 9) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(type + lVar1 + 8);
  }
  if ((uVar3 != 0) && ((bool)(-1 < *(int *)(type + uVar3) & bVar4))) {
    if (*(ushort *)(type + -(long)*(int *)type) < 9) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(type + lVar1 + 8);
    }
    if (uVar3 != 0) {
      pOVar2 = GetObjectByIndex(this,*(int32_t *)(type + uVar3));
      return pOVar2;
    }
    pOVar2 = GetObjectByIndex(this,-1);
    return pOVar2;
  }
  return (Object *)0x0;
}

Assistant:

const reflection::Object *GetObject(const reflection::Type *type,
                                      bool element_type = false) const {
    const reflection::BaseType base_type =
        element_type ? type->element() : type->base_type();
    if (type->index() >= 0 && IsStructOrTable(base_type)) {
      return GetObjectByIndex(type->index());
    }
    return nullptr;
  }